

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_case.cc
# Opt level: O0

void __thiscall CaseType::GenPrivDecls(CaseType *this,Output *out_h,Env *env)

{
  TypeType TVar1;
  undefined8 uVar2;
  char *pcVar3;
  ID *in_RSI;
  Env *unaff_retaddr;
  Output *in_stack_00000008;
  Type *in_stack_00000010;
  Type *t;
  Env *in_stack_00000110;
  Expr *in_stack_00000118;
  Env *this_00;
  ExternType *local_20;
  ID *local_10;
  
  local_10 = in_RSI;
  local_20 = (ExternType *)Expr::DataType(in_stack_00000118,in_stack_00000110);
  TVar1 = Type::tot((Type *)local_20);
  if (TVar1 != BUILTIN) {
    local_20 = extern_type_int;
  }
  this_00 = (Env *)&stack0xffffffffffffffc0;
  (*(local_20->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])();
  uVar2 = std::__cxx11::string::c_str();
  pcVar3 = Env::LValue(this_00,local_10);
  Output::println((Output *)local_10,"%s %s;",uVar2,pcVar3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  Type::GenPrivDecls(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void CaseType::GenPrivDecls(Output* out_h, Env* env)
	{
	Type* t = index_expr_->DataType(env);

	if ( t->tot() != Type::BUILTIN )
		// It's a Type::EXTERN with a C++ type of "int", "bool", or "enum",
		// any of which will convert consistently using an int as storage type.
		t = extern_type_int;

	out_h->println("%s %s;", t->DataTypeStr().c_str(), env->LValue(index_var_));
	Type::GenPrivDecls(out_h, env);
	}